

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_SSTable_fileIO(void)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  SSTableHeader *pSVar4;
  SSTableIndex *pSVar5;
  SSTableData *pSVar6;
  long lVar7;
  initializer_list<SSTableDataEntry> __l;
  SSTable s;
  SSTableData data;
  path local_148;
  SSTable t;
  SSTableDataEntry local_e0;
  SSTableDataEntry local_a0;
  SSTableDataEntry local_60;
  
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)&t,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_e0,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_a0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x75998cb,4,"NIMO");
  __l._M_len = 4;
  __l._M_array = (iterator)&t;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&data,__l,(allocator_type *)&s);
  lVar7 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&t.file._M_pathname._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x40;
  } while (lVar7 != -0x20);
  SSTable::SSTable(&t);
  SSTable::fillData(&t,&data);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&s.file,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk(&t,&s.file);
  std::filesystem::__cxx11::path::~path(&s.file);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&local_148,(char (*) [10])"testf.bin",auto_format);
  SSTable::SSTable(&s,&local_148);
  std::filesystem::__cxx11::path::~path(&local_148);
  pSVar4 = SSTable::getHeader(&s);
  if ((((pSVar4->key_min == 1) && (pSVar4->entries_count == 4)) && (pSVar4->key_max == 4)) &&
     (pSVar4->index_offset == 0x99)) {
    pSVar5 = SSTable::getIndex(&s);
    pSVar1 = (pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((((((long)(pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0x40) &&
          (pSVar1->key == 1)) &&
         ((pSVar1->offset == 0x20 && ((pSVar1[1].key == 2 && (pSVar1[1].offset == 0x45)))))) &&
        (pSVar1[2].key == 3)) &&
       (((pSVar1[2].offset == 99 && (pSVar1[3].key == 4)) && (pSVar1[3].offset == 0x7c)))) {
      pSVar6 = SSTable::getAllData(&s);
      remove("testf.bin");
      pSVar2 = (pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((((long)(pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 == 0x100) &&
          (pSVar2[3].delete_flag == false)) &&
         ((pSVar2[3].timestamp == 0x75998cb && (pSVar2[3].key == 4)))) {
        bVar3 = std::operator!=(&pSVar2[3].value,"NIMO");
        bVar3 = !bVar3;
        goto LAB_00103f2e;
      }
    }
  }
  bVar3 = false;
LAB_00103f2e:
  SSTable::~SSTable(&s);
  SSTable::~SSTable(&t);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&data);
  return bVar3;
}

Assistant:

bool test_SSTable_fileIO() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto t = SSTable{};
    t.fillData(data);
    t.writeToDisk("testf.bin");

    auto s = SSTable{"testf.bin"};

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index.size() != 4 ||
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }
    auto &d = *s.getAllData();

    remove("testf.bin");
    return !(d.size() != 4 || d[3].delete_flag != false || d[3].timestamp != 123312331 || d[3].key != 4 ||
             d[3].value != "NIMO");
}